

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

attribute_t choose_game_window_attributes(tgestate_t *state)

{
  tgestate_t *in_RDI;
  attribute_t attr;
  attribute_t local_9;
  
  if (in_RDI->room_index < 0x1d) {
    if (in_RDI->day_or_night == '\0') {
      local_9 = '\a';
    }
    else if (in_RDI->room_index == '\0') {
      local_9 = 'A';
    }
    else {
      local_9 = '\x05';
    }
  }
  else if ((in_RDI->items_held[0] == '\x04') || (in_RDI->items_held[1] == '\x04')) {
    local_9 = '\x02';
  }
  else {
    wipe_visible_tiles((tgestate_t *)0x108966);
    plot_interior_tiles(in_RDI);
    local_9 = '\x01';
  }
  in_RDI->game_window_attribute = local_9;
  return local_9;
}

Assistant:

attribute_t choose_game_window_attributes(tgestate_t *state)
{
  attribute_t attr;

  assert(state != NULL);

  if (state->room_index < room_29_SECOND_TUNNEL_START)
  {
    /* The hero is outside, or in a room, but not in a tunnel. */

    if (state->day_or_night == 0) /* Outside or room, daytime. */
      attr = attribute_WHITE_OVER_BLACK;
    else if (state->room_index == room_0_OUTDOORS) /* Outside, nighttime. */
      attr = attribute_BRIGHT_BLUE_OVER_BLACK;
    else /* Room, nighttime. */
      attr = attribute_CYAN_OVER_BLACK;
  }
  else
  {
    /* The hero is in a tunnel. */

    if (state->items_held[0] == item_TORCH ||
        state->items_held[1] == item_TORCH)
    {
      /* The hero holds a torch - draw the room. */

      attr = attribute_RED_OVER_BLACK;
    }
    else
    {
      /* The hero holds no torch - draw nothing. */

      wipe_visible_tiles(state);
      plot_interior_tiles(state);
      attr = attribute_BLUE_OVER_BLACK;
    }
  }

  state->game_window_attribute = attr;

  return attr;
}